

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::cert_compression_parse_clienthello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  unsigned_short uVar1;
  bool bVar2;
  uint16_t uVar3;
  int iVar4;
  pointer psVar5;
  size_t sVar6;
  unsigned_short *puVar7;
  CertCompressionAlg *pCVar8;
  unsigned_short *__last;
  size_t local_a0;
  size_t i_1;
  CertCompressionAlg *alg;
  size_t i;
  size_t sStack_80;
  uint16_t alg_id;
  size_t given_alg_idx;
  size_t best_index;
  undefined1 local_60 [8];
  Array<unsigned_short> given_alg_ids;
  size_t num_given_alg_ids;
  CBS alg_ids;
  size_t num_algs;
  SSL_CTX *ctx;
  CBS *contents_local;
  uint8_t *out_alert_local;
  SSL_HANDSHAKE *hs_local;
  
  if (contents == (CBS *)0x0) {
    hs_local._7_1_ = true;
  }
  else {
    psVar5 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&hs->ssl->ctx);
    alg_ids.len = Vector<bssl::CertCompressionAlg>::size(&psVar5->cert_compression_algs);
    iVar4 = CBS_get_u8_length_prefixed(contents,(CBS *)&num_given_alg_ids);
    if ((((iVar4 == 0) || (sVar6 = CBS_len(contents), sVar6 != 0)) ||
        (sVar6 = CBS_len((CBS *)&num_given_alg_ids), sVar6 == 0)) ||
       (sVar6 = CBS_len((CBS *)&num_given_alg_ids), (sVar6 & 1) == 1)) {
      hs_local._7_1_ = false;
    }
    else {
      sVar6 = CBS_len((CBS *)&num_given_alg_ids);
      given_alg_ids.size_ = sVar6 >> 1;
      Array<unsigned_short>::Array((Array<unsigned_short> *)local_60);
      bVar2 = Array<unsigned_short>::InitForOverwrite
                        ((Array<unsigned_short> *)local_60,given_alg_ids.size_);
      if (bVar2) {
        given_alg_idx = alg_ids.len;
        sStack_80 = 0;
LAB_0016d559:
        sVar6 = CBS_len((CBS *)&num_given_alg_ids);
        if (sVar6 != 0) {
          iVar4 = CBS_get_u16((CBS *)&num_given_alg_ids,(uint16_t *)((long)&i + 6));
          sVar6 = sStack_80;
          uVar1 = i._6_2_;
          if (iVar4 == 0) {
            hs_local._7_1_ = false;
            goto LAB_0016d79e;
          }
          sStack_80 = sStack_80 + 1;
          puVar7 = Array<unsigned_short>::operator[]((Array<unsigned_short> *)local_60,sVar6);
          *puVar7 = uVar1;
          for (alg = (CertCompressionAlg *)0x0; alg < alg_ids.len;
              alg = (CertCompressionAlg *)((long)&alg->compress + 1)) {
            pCVar8 = Vector<bssl::CertCompressionAlg>::operator[]
                               (&psVar5->cert_compression_algs,(size_t)alg);
            if ((pCVar8->alg_id == i._6_2_) &&
               (pCVar8->compress != (ssl_cert_compression_func_t)0x0)) {
              if (alg < given_alg_idx) {
                given_alg_idx = (size_t)alg;
              }
              break;
            }
          }
          goto LAB_0016d559;
        }
        puVar7 = Array<unsigned_short>::begin((Array<unsigned_short> *)local_60);
        __last = Array<unsigned_short>::end((Array<unsigned_short> *)local_60);
        std::sort<unsigned_short*>(puVar7,__last);
        for (local_a0 = 1; local_a0 < given_alg_ids.size_; local_a0 = local_a0 + 1) {
          puVar7 = Array<unsigned_short>::operator[]((Array<unsigned_short> *)local_60,local_a0 - 1)
          ;
          uVar1 = *puVar7;
          puVar7 = Array<unsigned_short>::operator[]((Array<unsigned_short> *)local_60,local_a0);
          if (uVar1 == *puVar7) {
            hs_local._7_1_ = false;
            goto LAB_0016d79e;
          }
        }
        if ((given_alg_idx < alg_ids.len) && (uVar3 = ssl_protocol_version(hs->ssl), 0x303 < uVar3))
        {
          *(uint *)&hs->field_0x6c8 = *(uint *)&hs->field_0x6c8 | 0x200000;
          pCVar8 = Vector<bssl::CertCompressionAlg>::operator[]
                             (&psVar5->cert_compression_algs,given_alg_idx);
          hs->cert_compression_alg_id = pCVar8->alg_id;
        }
        hs_local._7_1_ = true;
      }
      else {
        hs_local._7_1_ = false;
      }
LAB_0016d79e:
      best_index._0_4_ = 1;
      Array<unsigned_short>::~Array((Array<unsigned_short> *)local_60);
    }
  }
  return hs_local._7_1_;
}

Assistant:

static bool cert_compression_parse_clienthello(SSL_HANDSHAKE *hs,
                                               uint8_t *out_alert,
                                               CBS *contents) {
  if (contents == nullptr) {
    return true;
  }

  const SSL_CTX *ctx = hs->ssl->ctx.get();
  const size_t num_algs = ctx->cert_compression_algs.size();

  CBS alg_ids;
  if (!CBS_get_u8_length_prefixed(contents, &alg_ids) ||  //
      CBS_len(contents) != 0 ||                           //
      CBS_len(&alg_ids) == 0 ||                           //
      CBS_len(&alg_ids) % 2 == 1) {
    return false;
  }

  const size_t num_given_alg_ids = CBS_len(&alg_ids) / 2;
  Array<uint16_t> given_alg_ids;
  if (!given_alg_ids.InitForOverwrite(num_given_alg_ids)) {
    return false;
  }

  size_t best_index = num_algs;
  size_t given_alg_idx = 0;

  while (CBS_len(&alg_ids) > 0) {
    uint16_t alg_id;
    if (!CBS_get_u16(&alg_ids, &alg_id)) {
      return false;
    }

    given_alg_ids[given_alg_idx++] = alg_id;

    for (size_t i = 0; i < num_algs; i++) {
      const auto &alg = ctx->cert_compression_algs[i];
      if (alg.alg_id == alg_id && alg.compress != nullptr) {
        if (i < best_index) {
          best_index = i;
        }
        break;
      }
    }
  }

  std::sort(given_alg_ids.begin(), given_alg_ids.end());
  for (size_t i = 1; i < num_given_alg_ids; i++) {
    if (given_alg_ids[i - 1] == given_alg_ids[i]) {
      return false;
    }
  }

  if (best_index < num_algs &&
      ssl_protocol_version(hs->ssl) >= TLS1_3_VERSION) {
    hs->cert_compression_negotiated = true;
    hs->cert_compression_alg_id = ctx->cert_compression_algs[best_index].alg_id;
  }

  return true;
}